

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O1

void __thiscall TEST_SimpleString_StrStr_Test::testBody(TEST_SimpleString_StrStr_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  char empty [1];
  char foo [4];
  char barf [5];
  char foobarfoo [10];
  
  builtin_strncpy(foo,"foo",4);
  empty[0] = '\0';
  builtin_strncpy(foobarfoo,"foobarfoo",10);
  builtin_strncpy(barf,"barf",5);
  pUVar1 = UtestShell::getCurrent();
  pcVar2 = SimpleString::StrStr(foo,empty);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[8])
            (pUVar1,(ulong)(pcVar2 == foo),"CHECK","SimpleString::StrStr(foo, empty) == foo",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x411,pTVar3);
  pUVar1 = UtestShell::getCurrent();
  pcVar2 = SimpleString::StrStr(empty,foo);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[8])
            (pUVar1,(ulong)(pcVar2 == (char *)0x0),"CHECK",
             "SimpleString::StrStr(empty, foo) == NULLPTR",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x412,pTVar3);
  pUVar1 = UtestShell::getCurrent();
  pcVar2 = SimpleString::StrStr(foobarfoo,barf);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[8])
            (pUVar1,(ulong)(pcVar2 == foobarfoo + 3),"CHECK",
             "SimpleString::StrStr(foobarfoo, barf) == foobarfoo+3",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x413,pTVar3);
  pUVar1 = UtestShell::getCurrent();
  pcVar2 = SimpleString::StrStr(barf,foobarfoo);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[8])
            (pUVar1,(ulong)(pcVar2 == (char *)0x0),"CHECK",
             "SimpleString::StrStr(barf, foobarfoo) == NULLPTR",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x414,pTVar3);
  pUVar1 = UtestShell::getCurrent();
  pcVar2 = SimpleString::StrStr(foo,foo);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[8])
            (pUVar1,(ulong)(pcVar2 == foo),"CHECK","SimpleString::StrStr(foo, foo) == foo",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x415,pTVar3);
  return;
}

Assistant:

TEST(SimpleString, StrStr)
{
    char foo[] = "foo";
    char empty[] = "";
    char foobarfoo[] = "foobarfoo";
    char barf[] = "barf";
    CHECK(SimpleString::StrStr(foo, empty) == foo);
    CHECK(SimpleString::StrStr(empty, foo) == NULLPTR);
    CHECK(SimpleString::StrStr(foobarfoo, barf) == foobarfoo+3);
    CHECK(SimpleString::StrStr(barf, foobarfoo) == NULLPTR);
    CHECK(SimpleString::StrStr(foo, foo) == foo);
}